

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void __thiscall
vkt::anon_unknown_0::Subpass::Subpass
          (Subpass *this,VkPipelineBindPoint pipelineBindPoint,VkSubpassDescriptionFlags flags,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *inputAttachments,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *colorAttachments,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *resolveAttachments,AttachmentReference depthStencilAttachment,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preserveAttachments)

{
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *resolveAttachments_local;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *colorAttachments_local;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *inputAttachments_local;
  VkSubpassDescriptionFlags flags_local;
  VkPipelineBindPoint pipelineBindPoint_local;
  Subpass *this_local;
  
  this->m_pipelineBindPoint = pipelineBindPoint;
  this->m_flags = flags;
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_inputAttachments,inputAttachments);
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_colorAttachments,colorAttachments);
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_resolveAttachments,resolveAttachments);
  this->m_depthStencilAttachment = depthStencilAttachment;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->m_preserveAttachments,preserveAttachments);
  return;
}

Assistant:

Subpass						(VkPipelineBindPoint				pipelineBindPoint,
																	 VkSubpassDescriptionFlags			flags,
																	 const vector<AttachmentReference>&	inputAttachments,
																	 const vector<AttachmentReference>&	colorAttachments,
																	 const vector<AttachmentReference>&	resolveAttachments,
																	 AttachmentReference				depthStencilAttachment,
																	 const vector<deUint32>&			preserveAttachments)
		: m_pipelineBindPoint		(pipelineBindPoint)
		, m_flags					(flags)
		, m_inputAttachments		(inputAttachments)
		, m_colorAttachments		(colorAttachments)
		, m_resolveAttachments		(resolveAttachments)
		, m_depthStencilAttachment	(depthStencilAttachment)
		, m_preserveAttachments		(preserveAttachments)
	{
	}